

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

void __thiscall ON_SectionStyle::Dump(ON_SectionStyle *this,ON_TextLog *dump)

{
  ON_TextLog *pOVar1;
  SectionBackgroundFillMode SVar2;
  bool bVar3;
  SectionFillRule SVar4;
  uint uVar5;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_30;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_2c;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_28;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_24;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_20;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  ON_TextLog *local_18;
  ON_TextLog *dump_local;
  ON_SectionStyle *this_local;
  
  local_18 = dump;
  dump_local = (ON_TextLog *)this;
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  SVar2 = BackgroundFillMode(this);
  if (SVar2 == None) {
    ON_TextLog::Print(local_18,"No background fill\n");
  }
  else if (SVar2 == Viewport) {
    ON_TextLog::Print(local_18,"Viewport background fill\n");
  }
  else if (SVar2 == SolidColor) {
    ON_TextLog::Print(local_18,"Solid color background fill\n");
  }
  bVar3 = BoundaryVisible(this);
  if (bVar3) {
    ON_TextLog::Print(local_18,"Boundary visible\n");
  }
  else {
    ON_TextLog::Print(local_18,"Boundary not visible\n");
  }
  pOVar1 = local_18;
  BoundaryWidthScale(this);
  ON_TextLog::Print(pOVar1,"Boundary width scale = %g\n");
  SVar4 = SectionFillRule(this);
  if (SVar4 == ClosedCurves) {
    ON_TextLog::Print(local_18,"Fill when section makes closed curves\n");
  }
  else if (SVar4 == SolidObjects) {
    ON_TextLog::Print(local_18,"Fill only with solid objects\n");
  }
  pOVar1 = local_18;
  uVar5 = HatchIndex(this);
  ON_TextLog::Print(pOVar1,"Hatch index = %d\n",(ulong)uVar5);
  pOVar1 = local_18;
  HatchScale(this);
  ON_TextLog::Print(pOVar1,"Hatch scale = %g\n");
  pOVar1 = local_18;
  HatchRotation(this);
  ON_TextLog::Print(pOVar1,"Hatch rotation = %g\n");
  ON_TextLog::Print(local_18,"Boundary color");
  pOVar1 = local_18;
  local_1c = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,false);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_1c);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Boundary print color");
  pOVar1 = local_18;
  local_20 = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,true);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_20);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Background fill color");
  pOVar1 = local_18;
  local_24 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,false);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_24);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Background fill print color");
  pOVar1 = local_18;
  local_28 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,true);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_28);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Hatch color");
  pOVar1 = local_18;
  local_2c = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,false);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_2c);
  ON_TextLog::Print(local_18,"\n");
  ON_TextLog::Print(local_18,"Hatch print color");
  pOVar1 = local_18;
  local_30 = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,true);
  ON_TextLog::PrintColor(pOVar1,(ON_Color *)&local_30);
  ON_TextLog::Print(local_18,"\n");
  return;
}

Assistant:

void ON_SectionStyle::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);

  switch (BackgroundFillMode())
  {
  case ON_SectionStyle::SectionBackgroundFillMode::None:
    dump.Print("No background fill\n");
    break;
  case ON_SectionStyle::SectionBackgroundFillMode::Viewport:
    dump.Print("Viewport background fill\n");
    break;
  case ON_SectionStyle::SectionBackgroundFillMode::SolidColor:
    dump.Print("Solid color background fill\n");
    break;
  }

  if (BoundaryVisible())
    dump.Print("Boundary visible\n");
  else
    dump.Print("Boundary not visible\n");

  dump.Print("Boundary width scale = %g\n", BoundaryWidthScale());
  switch (SectionFillRule())
  {
  case ON::SectionFillRule::ClosedCurves:
    dump.Print("Fill when section makes closed curves\n");
    break;
  case ON::SectionFillRule::SolidObjects:
    dump.Print("Fill only with solid objects\n");
    break;
  }

  dump.Print("Hatch index = %d\n", HatchIndex());
  dump.Print("Hatch scale = %g\n", HatchScale());
  dump.Print("Hatch rotation = %g\n", HatchRotation());

  dump.Print("Boundary color");
  dump.PrintColor(BoundaryColor(false));
  dump.Print("\n");
  dump.Print("Boundary print color");
  dump.PrintColor(BoundaryColor(true));
  dump.Print("\n");
  dump.Print("Background fill color");
  dump.PrintColor(BackgroundFillColor(false));
  dump.Print("\n");
  dump.Print("Background fill print color");
  dump.PrintColor(BackgroundFillColor(true));
  dump.Print("\n");
  dump.Print("Hatch color");
  dump.PrintColor(HatchColor(false));
  dump.Print("\n");
  dump.Print("Hatch print color");
  dump.PrintColor(HatchColor(true));
  dump.Print("\n");
}